

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O2

int hwnet::http::HttpSession::on_header_field(http_parser *parser,char *at,size_t length)

{
  void *pvVar1;
  mapped_type *pmVar2;
  long lVar3;
  
  pvVar1 = parser->data;
  lVar3 = *(long *)((long)pvVar1 + 0x98);
  if (*(long *)(lVar3 + 0x88) != 0) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)(lVar3 + 0x50),(key_type *)(lVar3 + 0x80));
    std::__cxx11::string::_M_assign((string *)pmVar2);
    lVar3 = *(long *)((long)pvVar1 + 0x98);
    *(undefined8 *)(lVar3 + 0x88) = 0;
    **(undefined1 **)(lVar3 + 0x80) = 0;
    lVar3 = *(long *)((long)pvVar1 + 0x98);
    *(undefined8 *)(lVar3 + 0xa8) = 0;
    **(undefined1 **)(lVar3 + 0xa0) = 0;
    lVar3 = *(long *)((long)pvVar1 + 0x98);
  }
  std::__cxx11::string::append((char *)(lVar3 + 0x80),(ulong)at);
  return 0;
}

Assistant:

int HttpSession::on_header_field(http_parser *parser, const char *at, size_t length) {
	auto session = (HttpSession*)parser->data;
	if(!session->packet->field.empty()) {
		session->packet->headers[session->packet->field] = session->packet->value;
		session->packet->field.clear();
		session->packet->value.clear();
	}
	session->packet->field.append(at,length);
	return 0;
}